

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<long_const&,int_const&,pbrt::RandomizeStrategy_const&>
               (string *s,char *fmt,long *v,int *args,RandomizeStrategy *args_1)

{
  long lVar1;
  ulong uVar2;
  int *in_RCX;
  long *in_RDX;
  string *in_RSI;
  string *in_RDI;
  RandomizeStrategy *in_R8;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  RandomizeStrategy *in_stack_fffffffffffffd78;
  int *in_stack_fffffffffffffd80;
  string *psVar3;
  long *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  char **in_stack_fffffffffffffda8;
  char **in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  string local_228 [32];
  stringstream local_208 [16];
  undefined1 local_1f8 [32];
  char *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  LogLevel in_stack_fffffffffffffe44;
  string local_80 [32];
  undefined4 local_60;
  undefined1 local_4b;
  byte local_4a;
  byte local_49;
  string local_48 [32];
  
  copyToFormatString(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  lVar1 = std::__cxx11::string::find((char)local_48,0x2a);
  local_49 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_48,0x73);
  local_4a = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_48,100);
  local_4b = lVar1 != -1;
  if ((local_49 & 1) == 0) {
    if ((bool)local_4b) {
      psVar3 = local_48;
      uVar2 = std::__cxx11::string::find((char)psVar3,100);
      IntegerFormatTrait<long>::fmt();
      std::__cxx11::string::replace((ulong)psVar3,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<long_const&>(in_stack_fffffffffffffdb8,(long *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_80);
      std::__cxx11::string::~string(local_80);
    }
    else if ((local_4a & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                 in_stack_fffffffffffffe28);
      }
      std::__cxx11::string::c_str();
      formatOne<long_const&>(in_stack_fffffffffffffdb8,(long *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd90);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd90);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_208);
      std::ostream::operator<<(local_1f8,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_228);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
      std::__cxx11::stringstream::~stringstream(local_208);
    }
    stringPrintfRecursive<int_const&,pbrt::RandomizeStrategy_const&>
              (in_RSI,(char *)in_RDX,in_RCX,in_R8);
    local_60 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<long_const&,int_const&,pbrt::RandomizeStrategy_const&>
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_60 = 1;
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}